

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::detail::keep_alive_impl(handle nurse,handle patient)

{
  PyObject *nurse_00;
  bool bVar1;
  PyObject **ppPVar2;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__x;
  object local_58;
  weakref wr;
  handle local_48;
  cpp_function disable_lifesupport;
  undefined1 local_30 [8];
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> tinfo;
  handle patient_local;
  handle nurse_local;
  
  tinfo.
  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)patient.m_ptr;
  patient_local = nurse;
  bVar1 = pybind11::handle::operator_cast_to_bool(&patient_local);
  if ((bVar1) &&
     (bVar1 = pybind11::handle::operator_cast_to_bool
                        ((handle *)
                         &tinfo.
                          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
    bVar1 = object_api<pybind11::handle>::is_none
                      ((object_api<pybind11::handle> *)
                       &tinfo.
                        super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((!bVar1) &&
       (bVar1 = object_api<pybind11::handle>::is_none
                          ((object_api<pybind11::handle> *)&patient_local), !bVar1)) {
      ppPVar2 = pybind11::handle::ptr(&patient_local);
      __x = all_type_info((*ppPVar2)->ob_type);
      std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      vector((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              *)local_30,__x);
      bVar1 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::empty((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)local_30);
      if (bVar1) {
        wr.super_object.super_handle.m_ptr =
             (object)(object)tinfo.
                             super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        cpp_function::
        cpp_function<pybind11::detail::keep_alive_impl(pybind11::handle,pybind11::handle)::_lambda(pybind11::handle)_1_,,void>
                  ((cpp_function *)&local_48,(type *)&wr);
        weakref::weakref((weakref *)&local_58,patient_local,local_48);
        pybind11::handle::inc_ref
                  ((handle *)
                   &tinfo.
                    super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        object::release(&local_58);
        weakref::~weakref((weakref *)&local_58);
        cpp_function::~cpp_function((cpp_function *)&local_48);
      }
      else {
        ppPVar2 = pybind11::handle::ptr(&patient_local);
        nurse_00 = *ppPVar2;
        ppPVar2 = pybind11::handle::ptr
                            ((handle *)
                             &tinfo.
                              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        add_patient(nurse_00,*ppPVar2);
      }
      std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
      ~vector((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *)local_30);
    }
    return;
  }
  pybind11_fail("Could not activate keep_alive!");
}

Assistant:

void keep_alive_impl(handle nurse, handle patient) {
    if (!nurse || !patient)
        pybind11_fail("Could not activate keep_alive!");

    if (patient.is_none() || nurse.is_none())
        return; /* Nothing to keep alive or nothing to be kept alive by */

    auto tinfo = all_type_info(Py_TYPE(nurse.ptr()));
    if (!tinfo.empty()) {
        /* It's a pybind-registered type, so we can store the patient in the
         * internal list. */
        add_patient(nurse.ptr(), patient.ptr());
    }
    else {
        /* Fall back to clever approach based on weak references taken from
         * Boost.Python. This is not used for pybind-registered types because
         * the objects can be destroyed out-of-order in a GC pass. */
        cpp_function disable_lifesupport(
            [patient](handle weakref) { patient.dec_ref(); weakref.dec_ref(); });

        weakref wr(nurse, disable_lifesupport);

        patient.inc_ref(); /* reference patient and leak the weak reference */
        (void) wr.release();
    }
}